

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9703::OSTest_ConvertFileToMmapSize_Test::~OSTest_ConvertFileToMmapSize_Test
          (OSTest_ConvertFileToMmapSize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OSTest, ConvertFileToMmapSize) {
  EXPECT_THAT(mp::internal::ConvertFileToMmapSize(42, ""),
              testing::TypedEq<std::size_t>(42u));
  EXPECT_ASSERT(mp::internal::ConvertFileToMmapSize(-1, ""),
                "negative file size");
  fmt::ULongLong max_size = std::numeric_limits<std::size_t>::max();
  fmt::ULongLong max_long_long = std::numeric_limits<fmt::LongLong>::max();
  if (max_size < max_long_long) {
    EXPECT_EQ(max_size, mp::internal::ConvertFileToMmapSize(max_size, ""));
    EXPECT_THROW_MSG(mp::internal::ConvertFileToMmapSize(max_size + 1, "test"),
                     mp::Error, "file test is too big");
  } else {
    EXPECT_EQ(max_long_long,
              mp::internal::ConvertFileToMmapSize(max_long_long, ""));
  }
}